

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O1

void zStackCompress(GlobalLU_t *Glu)

{
  undefined8 *puVar1;
  int iVar2;
  int_t *piVar3;
  int_t *piVar4;
  int_t *piVar5;
  int_t *old;
  void *pvVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  doublecomplex *dnew;
  void *pvVar10;
  int_t *new;
  
  iVar8 = Glu->n;
  piVar3 = Glu->lsub;
  piVar4 = Glu->xlsub;
  piVar5 = Glu->xusub;
  old = Glu->usub;
  pvVar10 = (void *)((long)(Glu->xlusup[iVar8] << 4) + (long)Glu->lusup);
  iVar2 = piVar5[iVar8];
  if (0 < (long)iVar2) {
    pvVar6 = Glu->ucol;
    lVar9 = 0;
    do {
      puVar1 = (undefined8 *)((long)pvVar6 + lVar9);
      uVar7 = puVar1[1];
      *(undefined8 *)((long)pvVar10 + lVar9) = *puVar1;
      ((undefined8 *)((long)pvVar10 + lVar9))[1] = uVar7;
      lVar9 = lVar9 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar9);
  }
  new = (int_t *)((long)piVar5[iVar8] * 4 + (long)pvVar10);
  copy_mem_int(piVar4[iVar8],piVar3,new);
  piVar4 = new + piVar4[iVar8];
  copy_mem_int(piVar5[iVar8],old,piVar4);
  iVar2 = (Glu->stack).top1;
  iVar8 = (*(int *)&(Glu->stack).array + iVar2) - ((int)piVar4 + piVar5[iVar8] * 4);
  piVar3 = &(Glu->stack).used;
  *piVar3 = *piVar3 - iVar8;
  (Glu->stack).top1 = iVar2 - iVar8;
  Glu->ucol = pvVar10;
  Glu->lsub = new;
  Glu->usub = piVar4;
  return;
}

Assistant:

void
zStackCompress(GlobalLU_t *Glu)
{
    register int iword, dword, ndim;
    char     *last, *fragment;
    int_t    *ifrom, *ito;
    doublecomplex   *dfrom, *dto;
    int_t    *xlsub, *lsub, *xusub, *usub, *xlusup;
    doublecomplex   *ucol, *lusup;
    
    iword = sizeof(int);
    dword = sizeof(doublecomplex);
    ndim = Glu->n;

    xlsub  = Glu->xlsub;
    lsub   = Glu->lsub;
    xusub  = Glu->xusub;
    usub   = Glu->usub;
    xlusup = Glu->xlusup;
    ucol   = Glu->ucol;
    lusup  = Glu->lusup;
    
    dfrom = ucol;
    dto = (doublecomplex *)((char*)lusup + xlusup[ndim] * dword);
    copy_mem_doublecomplex(xusub[ndim], dfrom, dto);
    ucol = dto;

    ifrom = lsub;
    ito = (int_t *) ((char*)ucol + xusub[ndim] * iword);
    copy_mem_int(xlsub[ndim], ifrom, ito);
    lsub = ito;
    
    ifrom = usub;
    ito = (int_t *) ((char*)lsub + xlsub[ndim] * iword);
    copy_mem_int(xusub[ndim], ifrom, ito);
    usub = ito;
    
    last = (char*)usub + xusub[ndim] * iword;
    fragment = (char*) (((char*)Glu->stack.array + Glu->stack.top1) - last);
    Glu->stack.used -= (long int) fragment;
    Glu->stack.top1 -= (long int) fragment;

    Glu->ucol = ucol;
    Glu->lsub = lsub;
    Glu->usub = usub;
    
#if ( DEBUGlevel>=1 )
    printf("zStackCompress: fragment %lld\n", (long long) fragment);
    /* for (last = 0; last < ndim; ++last)
	print_lu_col("After compress:", last, 0);*/
#endif    
    
}